

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

ObjectiveCType google::protobuf::compiler::objectivec::GetObjectiveCType(Type field_type)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  Type local_10;
  ObjectiveCType local_c;
  Type field_type_local;
  
  switch(field_type) {
  case TYPE_DOUBLE:
    local_c = OBJECTIVECTYPE_DOUBLE;
    break;
  case TYPE_FLOAT:
    local_c = OBJECTIVECTYPE_FLOAT;
    break;
  case TYPE_INT64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    local_c = OBJECTIVECTYPE_INT64;
    break;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    local_c = OBJECTIVECTYPE_UINT64;
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    local_c = OBJECTIVECTYPE_INT32;
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    local_c = OBJECTIVECTYPE_UINT32;
    break;
  case TYPE_BOOL:
    local_c = OBJECTIVECTYPE_BOOLEAN;
    break;
  case TYPE_STRING:
    local_c = OBJECTIVECTYPE_STRING;
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    local_c = OBJECTIVECTYPE_MESSAGE;
    break;
  case TYPE_BYTES:
    local_c = OBJECTIVECTYPE_DATA;
    break;
  case TYPE_ENUM:
    local_c = OBJECTIVECTYPE_ENUM;
    break;
  default:
    local_10 = field_type;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
               ,0xc1);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  return local_c;
}

Assistant:

ObjectiveCType GetObjectiveCType(FieldDescriptor::Type field_type) {
  switch (field_type) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SFIXED32:
      return OBJECTIVECTYPE_INT32;

    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_FIXED32:
      return OBJECTIVECTYPE_UINT32;

    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_SFIXED64:
      return OBJECTIVECTYPE_INT64;

    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED64:
      return OBJECTIVECTYPE_UINT64;

    case FieldDescriptor::TYPE_FLOAT:
      return OBJECTIVECTYPE_FLOAT;

    case FieldDescriptor::TYPE_DOUBLE:
      return OBJECTIVECTYPE_DOUBLE;

    case FieldDescriptor::TYPE_BOOL:
      return OBJECTIVECTYPE_BOOLEAN;

    case FieldDescriptor::TYPE_STRING:
      return OBJECTIVECTYPE_STRING;

    case FieldDescriptor::TYPE_BYTES:
      return OBJECTIVECTYPE_DATA;

    case FieldDescriptor::TYPE_ENUM:
      return OBJECTIVECTYPE_ENUM;

    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return OBJECTIVECTYPE_MESSAGE;
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
  return OBJECTIVECTYPE_INT32;
}